

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

int loop_type_compar(ON_BrepLoop **ppLoopA,ON_BrepLoop **ppLoopB)

{
  ON_BrepLoop *pOVar1;
  ON_BrepLoop *pOVar2;
  ON_BrepLoop *loopB;
  ON_BrepLoop *loopA;
  ON_BrepLoop **ppLoopB_local;
  ON_BrepLoop **ppLoopA_local;
  
  pOVar1 = *ppLoopA;
  pOVar2 = *ppLoopB;
  if (pOVar1->m_type == pOVar2->m_type) {
    ppLoopA_local._4_4_ = 0;
  }
  else if (pOVar1->m_type == unknown) {
    ppLoopA_local._4_4_ = 1;
  }
  else if (pOVar2->m_type == unknown) {
    ppLoopA_local._4_4_ = -1;
  }
  else if ((int)pOVar1->m_type < (int)pOVar2->m_type) {
    ppLoopA_local._4_4_ = -1;
  }
  else if ((int)pOVar2->m_type < (int)pOVar1->m_type) {
    ppLoopA_local._4_4_ = 1;
  }
  else {
    ppLoopA_local._4_4_ = 0;
  }
  return ppLoopA_local._4_4_;
}

Assistant:

static int loop_type_compar(const ON_BrepLoop *const* ppLoopA, const ON_BrepLoop *const* ppLoopB )
{
  const ON_BrepLoop* loopA = *ppLoopA;
  const ON_BrepLoop* loopB = *ppLoopB;
  if ( loopA->m_type == loopB->m_type )
    return 0;
  if ( loopA->m_type == ON_BrepLoop::unknown )
    return 1;
  if ( loopB->m_type == ON_BrepLoop::unknown )
    return -1;
  if ( loopA->m_type < loopB->m_type )
    return -1;
  if ( loopA->m_type > loopB->m_type )
    return 1;
  return 0;
}